

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::DistanceFinder::find
          (SelectionSet *__return_storage_ptr__,DistanceFinder *this,SelectionSet *bs,
          RealType distance,int frame)

{
  double *pdVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  double dVar4;
  pointer pOVar5;
  SnapshotManager *pSVar6;
  RigidBody *this_00;
  StuntDouble *pSVar7;
  Atom *pAVar8;
  bool bVar9;
  double dVar10;
  uint i;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppMVar12;
  long lVar13;
  pointer ppSVar14;
  undefined4 extraout_var_01;
  pointer ppBVar15;
  undefined4 extraout_var_02;
  pointer ppBVar16;
  undefined4 extraout_var_03;
  pointer ppTVar17;
  undefined4 extraout_var_04;
  pointer ppIVar18;
  undefined4 extraout_var_05;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  Vector<double,_3U> result;
  Vector3d centerPos;
  SelectionSet local_e8;
  Vector3d local_c8;
  SelectionSet *local_b0;
  Vector3d local_a8;
  RealType local_90;
  SelectionSet local_88;
  double local_68 [3];
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  Snapshot *this_01;
  
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  pSVar6 = this->info_->sman_;
  local_90 = distance;
  iVar11 = (*pSVar6->_vptr_SnapshotManager[4])(pSVar6,(ulong)(uint)frame);
  this_01 = (Snapshot *)CONCAT44(extraout_var,iVar11);
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&this->nObjects_);
  local_b0 = __return_storage_ptr__;
  SelectionSet::SelectionSet(__return_storage_ptr__,&local_48);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ppSVar14 = (this->stuntdoubles_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->stuntdoubles_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar14) {
    uVar22 = 0;
    uVar21 = 1;
    do {
      this_00 = (RigidBody *)ppSVar14[uVar22];
      if ((this_00 != (RigidBody *)0x0) && ((this_00->super_StuntDouble).objType_ == otRigidBody)) {
        RigidBody::updateAtoms(this_00,frame);
      }
      ppSVar14 = (this->stuntdoubles_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar9 = uVar21 < (ulong)((long)(this->stuntdoubles_).
                                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar14 >>
                              3);
      uVar22 = uVar21;
      uVar21 = (ulong)((int)uVar21 + 1);
    } while (bVar9);
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            (&local_88.bitsets_,&bs->bitsets_);
  SelectionSet::parallelReduce(&local_e8,&local_88);
  local_c8.super_Vector<double,_3U>.data_[2] =
       (double)local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.super_Vector<double,_3U>.data_[1] =
       (double)local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_c8.super_Vector<double,_3U>.data_[0] =
       (double)local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_88.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_e8.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_e8.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_e8.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_e8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_c8);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_e8.bitsets_);
  lVar13 = (long)((local_88.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)->bitset_).
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p;
  if (((long)((local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start)->bitset_).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_p - lVar13) * 8 +
      (ulong)((local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start)->bitset_).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset != 0) {
    uVar22 = 0;
    do {
      uVar19 = (ulong)(int)uVar22;
      uVar21 = uVar19 + 0x3f;
      if (-1 < (long)uVar19) {
        uVar21 = uVar19;
      }
      local_50 = uVar22;
      if ((*(ulong *)(lVar13 + ((long)uVar21 >> 6) * 8 + -8 +
                     (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar22 & 0x3f) & 1) != 0) {
        pSVar7 = (this->stuntdoubles_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar22];
        iVar11 = (*pSVar7->snapshotMan_->_vptr_SnapshotManager[4])
                           (pSVar7->snapshotMan_,(ulong)(uint)frame);
        lVar13 = *(long *)(CONCAT44(extraout_var_00,iVar11) + pSVar7->storage_);
        local_68[2] = *(double *)(lVar13 + 0x10 + (long)pSVar7->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar13 + (long)pSVar7->localIndex_ * 0x18);
        local_68[0] = *pdVar1;
        local_68[1] = pdVar1[1];
        ppMVar12 = (this->molecules_).
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((this->molecules_).
            super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppMVar12) {
          uVar22 = 0;
          do {
            if (ppMVar12[uVar22] != (Molecule *)0x0) {
              Molecule::getCom(&local_a8,ppMVar12[uVar22],frame);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar13 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar13] =
                     (pointer)(local_68[lVar13] - local_a8.super_Vector<double,_3U>.data_[lVar13]);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              Snapshot::wrapVector(this_01,&local_c8);
              dVar10 = 0.0;
              lVar13 = 0;
              do {
                dVar4 = local_c8.super_Vector<double,_3U>.data_[lVar13];
                dVar10 = dVar10 + dVar4 * dVar4;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar21 = uVar22 + 0x3f;
                if (-1 < (long)uVar22) {
                  uVar21 = uVar22;
                }
                puVar3 = (ulong *)(((long)uVar21 >> 6) * 8 +
                                   *(long *)&(local_b0->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar22 & 0x3f);
              }
            }
            uVar22 = uVar22 + 1;
            ppMVar12 = (this->molecules_).
                       super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (uVar22 < (ulong)((long)(this->molecules_).
                                          super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppMVar12 >> 3));
        }
        ppSVar14 = (this->stuntdoubles_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((this->stuntdoubles_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppSVar14) {
          uVar22 = 0;
          do {
            if (ppSVar14[uVar22] != (StuntDouble *)0x0) {
              pSVar7 = ppSVar14[uVar22];
              iVar11 = (*pSVar7->snapshotMan_->_vptr_SnapshotManager[4])
                                 (pSVar7->snapshotMan_,(ulong)(uint)frame);
              lVar13 = *(long *)(CONCAT44(extraout_var_01,iVar11) + pSVar7->storage_);
              local_a8.super_Vector<double,_3U>.data_[2] =
                   (double)*(pointer *)(lVar13 + 0x10 + (long)pSVar7->localIndex_ * 0x18);
              puVar2 = (undefined8 *)(lVar13 + (long)pSVar7->localIndex_ * 0x18);
              local_a8.super_Vector<double,_3U>.data_[0] = (double)*puVar2;
              local_a8.super_Vector<double,_3U>.data_[1] = (double)puVar2[1];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar13 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar13] =
                     (pointer)(local_68[lVar13] - local_a8.super_Vector<double,_3U>.data_[lVar13]);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              Snapshot::wrapVector(this_01,&local_c8);
              dVar10 = 0.0;
              lVar13 = 0;
              do {
                dVar4 = local_c8.super_Vector<double,_3U>.data_[lVar13];
                dVar10 = dVar10 + dVar4 * dVar4;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar21 = uVar22 + 0x3f;
                if (-1 < (long)uVar22) {
                  uVar21 = uVar22;
                }
                puVar3 = (ulong *)(((long)uVar21 >> 6) * 8 +
                                   *(long *)&(((local_b0->bitsets_).
                                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar22 & 0x3f);
              }
            }
            uVar22 = uVar22 + 1;
            ppSVar14 = (this->stuntdoubles_).
                       super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar22 < (ulong)((long)(this->stuntdoubles_).
                                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppSVar14 >> 3));
        }
        ppBVar15 = (this->bonds_).
                   super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppBVar15) {
          uVar22 = 0;
          do {
            if (ppBVar15[uVar22] != (Bond *)0x0) {
              pAVar8 = *(ppBVar15[uVar22]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pSVar6 = (pAVar8->super_StuntDouble).snapshotMan_;
              iVar11 = (*pSVar6->_vptr_SnapshotManager[4])(pSVar6,(ulong)(uint)frame);
              lVar20 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar13 = *(long *)(CONCAT44(extraout_var_02,iVar11) +
                                (pAVar8->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar13 + 0x10 + lVar20 * 0x18);
              pdVar1 = (double *)(lVar13 + lVar20 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              lVar13 = *(long *)(*(long *)&((this->bonds_).
                                            super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                           super_ShortRangeInteraction).atoms_.
                                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                           ._M_impl.super__Vector_impl_data + 8);
              lVar20 = (**(code **)(**(long **)(lVar13 + 0x18) + 0x20))
                                 (*(long **)(lVar13 + 0x18),frame);
              lVar20 = *(long *)(lVar20 + *(long *)(lVar13 + 0x10));
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar20 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              puVar2 = (undefined8 *)(lVar20 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar13 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar13] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar13] +
                     local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar13 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar13] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar13] * 0.5);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar13] =
                     local_68[lVar13] - local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_01,(Vector3d *)&local_e8);
              dVar10 = 0.0;
              lVar13 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar13];
                dVar10 = dVar10 + (double)pOVar5 * (double)pOVar5;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar21 = uVar22 + 0x3f;
                if (-1 < (long)uVar22) {
                  uVar21 = uVar22;
                }
                puVar3 = (ulong *)(((long)uVar21 >> 6) * 8 +
                                   *(long *)&(local_b0->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar22 & 0x3f);
              }
            }
            uVar22 = uVar22 + 1;
            ppBVar15 = (this->bonds_).
                       super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while (uVar22 < (ulong)((long)(this->bonds_).
                                          super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppBVar15 >> 3));
        }
        ppBVar16 = (this->bends_).
                   super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppBVar16) {
          uVar22 = 0;
          do {
            if (ppBVar16[uVar22] != (Bend *)0x0) {
              pAVar8 = *(ppBVar16[uVar22]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pSVar6 = (pAVar8->super_StuntDouble).snapshotMan_;
              iVar11 = (*pSVar6->_vptr_SnapshotManager[4])(pSVar6,(ulong)(uint)frame);
              lVar20 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar13 = *(long *)(CONCAT44(extraout_var_03,iVar11) +
                                (pAVar8->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar13 + 0x10 + lVar20 * 0x18);
              pdVar1 = (double *)(lVar13 + lVar20 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              lVar13 = *(long *)(*(long *)&((this->bends_).
                                            super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                           super_ShortRangeInteraction).atoms_.
                                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                           ._M_impl.super__Vector_impl_data + 8);
              lVar20 = (**(code **)(**(long **)(lVar13 + 0x18) + 0x20))
                                 (*(long **)(lVar13 + 0x18),frame);
              lVar20 = *(long *)(lVar20 + *(long *)(lVar13 + 0x10));
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar20 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              puVar2 = (undefined8 *)(lVar20 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar13 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar13] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar13] +
                     local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              lVar13 = *(long *)(*(long *)&((this->bends_).
                                            super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                           super_ShortRangeInteraction).atoms_.
                                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                           ._M_impl.super__Vector_impl_data + 0x10);
              lVar20 = (**(code **)(**(long **)(lVar13 + 0x18) + 0x20))
                                 (*(long **)(lVar13 + 0x18),frame);
              lVar20 = *(long *)(lVar20 + *(long *)(lVar13 + 0x10));
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar20 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              puVar2 = (undefined8 *)(lVar20 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar13 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar13] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar13] +
                     local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar13 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar13] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar13] / 3.0);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar13] =
                     local_68[lVar13] - local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_01,(Vector3d *)&local_e8);
              dVar10 = 0.0;
              lVar13 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar13];
                dVar10 = dVar10 + (double)pOVar5 * (double)pOVar5;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar21 = uVar22 + 0x3f;
                if (-1 < (long)uVar22) {
                  uVar21 = uVar22;
                }
                puVar3 = (ulong *)(((long)uVar21 >> 6) * 8 +
                                   *(long *)&(local_b0->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[2].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar22 & 0x3f);
              }
            }
            uVar22 = uVar22 + 1;
            ppBVar16 = (this->bends_).
                       super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while (uVar22 < (ulong)((long)(this->bends_).
                                          super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppBVar16 >> 3));
        }
        ppTVar17 = (this->torsions_).
                   super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        if ((this->torsions_).
            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppTVar17) {
          uVar22 = 0;
          do {
            if (ppTVar17[uVar22] != (Torsion *)0x0) {
              pAVar8 = *(ppTVar17[uVar22]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pSVar6 = (pAVar8->super_StuntDouble).snapshotMan_;
              iVar11 = (*pSVar6->_vptr_SnapshotManager[4])(pSVar6,(ulong)(uint)frame);
              lVar20 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar13 = *(long *)(CONCAT44(extraout_var_04,iVar11) +
                                (pAVar8->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar13 + 0x10 + lVar20 * 0x18);
              pdVar1 = (double *)(lVar13 + lVar20 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              lVar13 = *(long *)(*(long *)&((this->torsions_).
                                            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                           super_ShortRangeInteraction).atoms_.
                                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                           ._M_impl.super__Vector_impl_data + 8);
              lVar20 = (**(code **)(**(long **)(lVar13 + 0x18) + 0x20))
                                 (*(long **)(lVar13 + 0x18),frame);
              lVar20 = *(long *)(lVar20 + *(long *)(lVar13 + 0x10));
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar20 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              puVar2 = (undefined8 *)(lVar20 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar13 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar13] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar13] +
                     local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              lVar13 = *(long *)(*(long *)&((this->torsions_).
                                            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                           super_ShortRangeInteraction).atoms_.
                                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                           ._M_impl.super__Vector_impl_data + 0x10);
              lVar20 = (**(code **)(**(long **)(lVar13 + 0x18) + 0x20))
                                 (*(long **)(lVar13 + 0x18),frame);
              lVar20 = *(long *)(lVar20 + *(long *)(lVar13 + 0x10));
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar20 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              puVar2 = (undefined8 *)(lVar20 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar13 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar13] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar13] +
                     local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              lVar13 = *(long *)(*(long *)&((this->torsions_).
                                            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                           super_ShortRangeInteraction).atoms_.
                                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                           ._M_impl.super__Vector_impl_data + 0x18);
              lVar20 = (**(code **)(**(long **)(lVar13 + 0x18) + 0x20))
                                 (*(long **)(lVar13 + 0x18),frame);
              lVar20 = *(long *)(lVar20 + *(long *)(lVar13 + 0x10));
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar20 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              puVar2 = (undefined8 *)(lVar20 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar13 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar13] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar13] +
                     local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar13 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar13] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar13] * 0.25);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar13] =
                     local_68[lVar13] - local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_01,(Vector3d *)&local_e8);
              dVar10 = 0.0;
              lVar13 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar13];
                dVar10 = dVar10 + (double)pOVar5 * (double)pOVar5;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar21 = uVar22 + 0x3f;
                if (-1 < (long)uVar22) {
                  uVar21 = uVar22;
                }
                puVar3 = (ulong *)(((long)uVar21 >> 6) * 8 +
                                   *(long *)&(local_b0->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[3].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar22 & 0x3f);
              }
            }
            uVar22 = uVar22 + 1;
            ppTVar17 = (this->torsions_).
                       super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (uVar22 < (ulong)((long)(this->torsions_).
                                          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar17 >> 3));
        }
        ppIVar18 = (this->inversions_).
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((this->inversions_).
            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppIVar18) {
          uVar22 = 0;
          do {
            if (ppIVar18[uVar22] != (Inversion *)0x0) {
              pAVar8 = *(ppIVar18[uVar22]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pSVar6 = (pAVar8->super_StuntDouble).snapshotMan_;
              iVar11 = (*pSVar6->_vptr_SnapshotManager[4])(pSVar6,(ulong)(uint)frame);
              lVar20 = (long)(pAVar8->super_StuntDouble).localIndex_;
              lVar13 = *(long *)(CONCAT44(extraout_var_05,iVar11) +
                                (pAVar8->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar13 + 0x10 + lVar20 * 0x18);
              pdVar1 = (double *)(lVar13 + lVar20 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              lVar13 = *(long *)(*(long *)&((this->inversions_).
                                            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                           super_ShortRangeInteraction).atoms_.
                                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                           ._M_impl.super__Vector_impl_data + 8);
              lVar20 = (**(code **)(**(long **)(lVar13 + 0x18) + 0x20))
                                 (*(long **)(lVar13 + 0x18),frame);
              lVar20 = *(long *)(lVar20 + *(long *)(lVar13 + 0x10));
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar20 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              puVar2 = (undefined8 *)(lVar20 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar13 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar13] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar13] +
                     local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              lVar13 = *(long *)(*(long *)&((this->inversions_).
                                            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                           super_ShortRangeInteraction).atoms_.
                                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                           ._M_impl.super__Vector_impl_data + 0x10);
              lVar20 = (**(code **)(**(long **)(lVar13 + 0x18) + 0x20))
                                 (*(long **)(lVar13 + 0x18),frame);
              lVar20 = *(long *)(lVar20 + *(long *)(lVar13 + 0x10));
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar20 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              puVar2 = (undefined8 *)(lVar20 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar13 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar13] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar13] +
                     local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              lVar13 = *(long *)(*(long *)&((this->inversions_).
                                            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                           super_ShortRangeInteraction).atoms_.
                                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                           ._M_impl.super__Vector_impl_data + 0x18);
              lVar20 = (**(code **)(**(long **)(lVar13 + 0x18) + 0x20))
                                 (*(long **)(lVar13 + 0x18),frame);
              lVar20 = *(long *)(lVar20 + *(long *)(lVar13 + 0x10));
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar20 + 0x10 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              puVar2 = (undefined8 *)(lVar20 + (long)*(int *)(lVar13 + 0x30) * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar13 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar13] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar13] +
                     local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar13 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar13] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar13] * 0.25);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar13] =
                     local_68[lVar13] - local_c8.super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_01,(Vector3d *)&local_e8);
              dVar10 = 0.0;
              lVar13 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar13];
                dVar10 = dVar10 + (double)pOVar5 * (double)pOVar5;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              if (dVar10 <= local_90) {
                uVar21 = uVar22 + 0x3f;
                if (-1 < (long)uVar22) {
                  uVar21 = uVar22;
                }
                puVar3 = (ulong *)(((long)uVar21 >> 6) * 8 +
                                   *(long *)&(local_b0->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[4].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar22 & 0x3f);
              }
            }
            uVar22 = uVar22 + 1;
            ppIVar18 = (this->inversions_).
                       super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar22 < (ulong)((long)(this->inversions_).
                                          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppIVar18 >> 3));
        }
      }
      uVar22 = local_50 + 1;
      lVar13 = (long)((local_88.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p;
    } while (uVar22 < (ulong)((local_88.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)((local_88.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      lVar13) * 8);
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_88.bitsets_);
  return local_b0;
}

Assistant:

SelectionSet DistanceFinder::find(const SelectionSet& bs, RealType distance,
                                    int frame) {
    StuntDouble* center;
    Vector3d centerPos;
    Snapshot* currSnapshot = info_->getSnapshotManager()->getSnapshot(frame);
    SelectionSet bsResult(nObjects_);
    assert(bsResult.size() == bs.size());

#ifdef IS_MPI
    int mol;
    int proc;
    RealType data[3];
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (unsigned int j = 0; j < stuntdoubles_.size(); ++j) {
      if (stuntdoubles_[j] != NULL) {
        if (stuntdoubles_[j]->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(stuntdoubles_[j]);
          rb->updateAtoms(frame);
        }
      }
    }

    SelectionSet bsTemp = bs;
    bsTemp              = bsTemp.parallelReduce();

    for (size_t i = 0; i < bsTemp.bitsets_[STUNTDOUBLE].size(); ++i) {
      if (bsTemp.bitsets_[STUNTDOUBLE][i]) {
        // Now, if we own stuntdouble i, we can use the position, but in
        // parallel, we'll need to let everyone else know what that
        // position is!

#ifdef IS_MPI
        mol  = info_->getGlobalMolMembership(i);
        proc = info_->getMolToProc(mol);

        if (proc == worldRank) {
          center    = stuntdoubles_[i];
          centerPos = center->getPos(frame);
          data[0]   = centerPos.x();
          data[1]   = centerPos.y();
          data[2]   = centerPos.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
          centerPos = Vector3d(data);
        }
#else
        center    = stuntdoubles_[i];
        centerPos = center->getPos(frame);
#endif
        for (size_t j = 0; j < molecules_.size(); ++j) {
          if (molecules_[j] != NULL) {
            Vector3d r = centerPos - molecules_[j]->getCom(frame);
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[MOLECULE].setBitOn(j);
            }
          }
        }

        for (size_t j = 0; j < stuntdoubles_.size(); ++j) {
          if (stuntdoubles_[j] != NULL) {
            Vector3d r = centerPos - stuntdoubles_[j]->getPos(frame);
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[STUNTDOUBLE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < bonds_.size(); ++j) {
          if (bonds_[j] != NULL) {
            Vector3d loc = bonds_[j]->getAtomA()->getPos(frame);
            loc += bonds_[j]->getAtomB()->getPos(frame);
            loc        = loc / 2.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BOND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < bends_.size(); ++j) {
          if (bends_[j] != NULL) {
            Vector3d loc = bends_[j]->getAtomA()->getPos(frame);
            loc += bends_[j]->getAtomB()->getPos(frame);
            loc += bends_[j]->getAtomC()->getPos(frame);
            loc        = loc / 3.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BEND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < torsions_.size(); ++j) {
          if (torsions_[j] != NULL) {
            Vector3d loc = torsions_[j]->getAtomA()->getPos(frame);
            loc += torsions_[j]->getAtomB()->getPos(frame);
            loc += torsions_[j]->getAtomC()->getPos(frame);
            loc += torsions_[j]->getAtomD()->getPos(frame);
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[TORSION].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < inversions_.size(); ++j) {
          if (inversions_[j] != NULL) {
            Vector3d loc = inversions_[j]->getAtomA()->getPos(frame);
            loc += inversions_[j]->getAtomB()->getPos(frame);
            loc += inversions_[j]->getAtomC()->getPos(frame);
            loc += inversions_[j]->getAtomD()->getPos(frame);
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[INVERSION].setBitOn(j);
            }
          }
        }
      }
    }
    return bsResult;
  }